

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

bool __thiscall sylvan::Bdd::operator<=(Bdd *this,Bdd *other)

{
  TD_sylvan_disjoint *t;
  Task local_48;
  
  local_48.d._0_8_ = this->bdd;
  local_48.d._8_8_ = other->bdd ^ 0x8000000000000000;
  local_48.f = sylvan_disjoint_WRAP;
  local_48.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
  local_48.d[0x10] = '\0';
  local_48.d[0x11] = '\0';
  local_48.d[0x12] = '\0';
  local_48.d[0x13] = '\0';
  lace_run_task(&local_48);
  return local_48.d[0] == '\x01';
}

Assistant:

bool
Bdd::operator<=(const Bdd& other) const
{
    return sylvan_subset(this->bdd, other.bdd) == 1;
}